

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Copy.cpp
# Opt level: O2

void __thiscall ObserverManager_Stack_Test::TestBody(ObserverManager_Stack_Test *this)

{
  char *pcVar1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_1;
  AssertHelper local_1d0;
  A a;
  stringstream out;
  ostream local_180 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&out);
  std::__cxx11::string::string((string *)&gtest_ar_1,"A",(allocator *)&gtest_ar);
  A::A(&a,local_180,(string *)&gtest_ar_1);
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  ObserverManager::subscribe<FooBarProtocol,A>(&a);
  ObserverManager::notify<FooBarProtocol>((ObserverManager *)0x11,0);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"A \"","out.str()",(char (*) [3])0x14b793,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_1);
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/fnz[P]ObserverManager/Tests/Copy.cpp"
               ,0xe,pcVar1);
    testing::internal::AssertHelper::operator=(&local_1d0,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper(&local_1d0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  A::~A(&a);
  ObserverManager::notify<FooBarProtocol>((ObserverManager *)0x11,0);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            ((internal *)&gtest_ar_1,"\"A \"","out.str()",(char (*) [3])0x14b793,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&a);
  std::__cxx11::string::~string((string *)&a);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&a);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/fnz[P]ObserverManager/Tests/Copy.cpp"
               ,0x12,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&a);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&a);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  std::__cxx11::stringstream::~stringstream((stringstream *)&out);
  return;
}

Assistant:

TEST(ObserverManager, Stack) {
    std::stringstream out;

    {
        A a(out, "A");
        ObserverManager::subscribe<FooBarProtocol>(&a);
        ObserverManager::notify(&FooBarProtocol::foo);
        EXPECT_EQ("A ", out.str());
    }

    ObserverManager::notify(&FooBarProtocol::foo);
    EXPECT_EQ("A ", out.str());
}